

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall ConvexDecomposition::Quaternion::Normalize(Quaternion *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  
  fVar5 = (this->super_float4).w;
  fVar1 = (this->super_float4).x;
  fVar2 = (this->super_float4).y;
  fVar3 = (this->super_float4).z;
  fVar5 = fVar5 * fVar5 + fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    auVar4 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    fVar5 = auVar4._0_4_;
  }
  if (1e-09 <= fVar5) {
    fVar5 = 1.0 / fVar5;
    (this->super_float4).x = fVar5 * (this->super_float4).x;
    (this->super_float4).y = fVar5 * (this->super_float4).y;
    (this->super_float4).z = fVar5 * (this->super_float4).z;
    (this->super_float4).w = fVar5 * (this->super_float4).w;
  }
  else {
    (this->super_float4).z = 0.0;
    (this->super_float4).w = 1.0;
    (this->super_float4).x = 0.0;
    (this->super_float4).y = 0.0;
  }
  return;
}

Assistant:

void Quaternion::Normalize()
{
	float m = sqrtf(sqr(w)+sqr(x)+sqr(y)+sqr(z));
	if(m<0.000000001f) {
		w=1.0f;
		x=y=z=0.0f;
		return;
	}
	(*this) *= (1.0f/m);
}